

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cc
# Opt level: O0

void Minisat::printUsageAndExit(int param_1,char **argv,bool verbose)

{
  char *pcVar1;
  FILE *pFVar2;
  Size SVar3;
  char **ppcVar4;
  vec<Minisat::Option_*,_int> *pvVar5;
  Option **ppOVar6;
  char *type;
  char *cat;
  char *pcStack_40;
  int i;
  char *prev_type;
  char *prev_cat;
  char *usage;
  bool verbose_local;
  char **argv_local;
  int param_0_local;
  
  ppcVar4 = Option::getUsageString();
  if (*ppcVar4 != (char *)0x0) {
    fprintf(_stderr,*ppcVar4,*argv);
  }
  pvVar5 = Option::getOptionList();
  sort<Minisat::Option*,Minisat::Option::OptionLt>(pvVar5);
  prev_type = (char *)0x0;
  pcStack_40 = (char *)0x0;
  cat._4_4_ = 0;
  while( true ) {
    pvVar5 = Option::getOptionList();
    SVar3 = vec<Minisat::Option_*,_int>::size(pvVar5);
    if (SVar3 <= cat._4_4_) break;
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,cat._4_4_);
    pcVar1 = (*ppOVar6)->category;
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,cat._4_4_);
    if (pcVar1 == prev_type) {
      if ((*ppOVar6)->type_name != pcStack_40) {
        fprintf(_stderr,"\n");
      }
    }
    else {
      fprintf(_stderr,"\n%s OPTIONS:\n\n",pcVar1);
    }
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,cat._4_4_);
    (*(*ppOVar6)->_vptr_Option[3])(*ppOVar6,(ulong)verbose & 1);
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,cat._4_4_);
    prev_type = (*ppOVar6)->category;
    pvVar5 = Option::getOptionList();
    ppOVar6 = vec<Minisat::Option_*,_int>::operator[](pvVar5,cat._4_4_);
    pcStack_40 = (*ppOVar6)->type_name;
    cat._4_4_ = cat._4_4_ + 1;
  }
  fprintf(_stderr,"\nHELP OPTIONS:\n\n");
  pFVar2 = _stderr;
  ppcVar4 = Option::getHelpPrefixString();
  fprintf(pFVar2,"  --%shelp        Print help message.\n",*ppcVar4);
  pFVar2 = _stderr;
  ppcVar4 = Option::getHelpPrefixString();
  fprintf(pFVar2,"  --%shelp-verb   Print verbose help message.\n",*ppcVar4);
  fprintf(_stderr,"\n");
  exit(0);
}

Assistant:

void Minisat::printUsageAndExit (int /*argc*/, char** argv, bool verbose)
{
    const char* usage = Option::getUsageString();
    if (usage != NULL)
        fprintf(stderr, usage, argv[0]);

    sort(Option::getOptionList(), Option::OptionLt());

    const char* prev_cat  = NULL;
    const char* prev_type = NULL;

    for (int i = 0; i < Option::getOptionList().size(); i++){
        const char* cat  = Option::getOptionList()[i]->category;
        const char* type = Option::getOptionList()[i]->type_name;

        if (cat != prev_cat)
            fprintf(stderr, "\n%s OPTIONS:\n\n", cat);
        else if (type != prev_type)
            fprintf(stderr, "\n");

        Option::getOptionList()[i]->help(verbose);

        prev_cat  = Option::getOptionList()[i]->category;
        prev_type = Option::getOptionList()[i]->type_name;
    }

    fprintf(stderr, "\nHELP OPTIONS:\n\n");
    fprintf(stderr, "  --%shelp        Print help message.\n", Option::getHelpPrefixString());
    fprintf(stderr, "  --%shelp-verb   Print verbose help message.\n", Option::getHelpPrefixString());
    fprintf(stderr, "\n");
    exit(0);
}